

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptNativeIntArray::NewInstance(RecyclableObject *function,Arguments *args)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  uint32 length;
  undefined4 *puVar3;
  JavascriptNativeIntArray *pJVar4;
  Var aValue;
  JavascriptArray *this;
  uint uVar5;
  JavascriptLibrary *this_00;
  double T1;
  
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01441eb0,NativeArrayPhase);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x54f,
                                "(!Js::Configuration::Global.flags.Off.IsEnabled((NativeArrayPhase)))"
                                ,"!PHASE_OFF1(NativeArrayPhase)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  uVar5 = *(uint *)&args->Info & 0xffffff;
  if (uVar5 < 2) {
    pJVar4 = JavascriptLibrary::CreateNativeIntArray
                       ((((function->type).ptr)->javascriptLibrary).ptr);
    return pJVar4;
  }
  if (uVar5 == 2) {
    aValue = Arguments::operator[](args,1);
    bVar2 = TaggedInt::Is(aValue);
    if (bVar2) {
      length = TaggedInt::ToInt32(aValue);
      this_00 = (((function->type).ptr)->javascriptLibrary).ptr;
      if ((int)length < 0) {
LAB_00a41bd6:
        JavascriptError::ThrowRangeError
                  ((this_00->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ec5b,(PCWSTR)0x0)
        ;
      }
    }
    else {
      if ((ulong)aValue >> 0x32 == 0) {
        this = JavascriptLibrary::CreateArray((((function->type).ptr)->javascriptLibrary).ptr,1);
        JavascriptArray::DirectSetItemAt<void*>(this,0,aValue);
        goto LAB_00a41b81;
      }
      T1 = JavascriptNumber::GetValue(aValue);
      length = JavascriptConversion::ToUInt32(T1);
      this_00 = (((function->type).ptr)->javascriptLibrary).ptr;
      if ((T1 != (double)length) || (NAN(T1) || NAN((double)length))) goto LAB_00a41bd6;
    }
    this = (JavascriptArray *)JavascriptLibrary::CreateNativeIntArray(this_00,length);
  }
  else {
    pJVar4 = JavascriptLibrary::CreateNativeIntArray
                       ((((function->type).ptr)->javascriptLibrary).ptr,uVar5 - 1);
    this = (JavascriptArray *)
           (**(code **)((long)(pJVar4->super_JavascriptNativeArray).super_JavascriptArray.
                              super_ArrayObject.super_DynamicObject.super_RecyclableObject.
                              super_FinalizableObject.super_IRecyclerVisitedObject + 0x3b0))
                     (pJVar4,(*(uint *)&args->Info & 0xffffff) - 1,0,args->Values,0,0);
  }
LAB_00a41b81:
  (**(code **)((long)(((JavascriptNativeArray *)&this->super_ArrayObject)->super_JavascriptArray).
                     super_ArrayObject.super_DynamicObject.super_RecyclableObject.
                     super_FinalizableObject.super_IRecyclerVisitedObject + 0x3a0))(this);
  return this;
}

Assistant:

Var JavascriptNativeIntArray::NewInstance(RecyclableObject* function, Arguments args)
    {
        Assert(!PHASE_OFF1(NativeArrayPhase));

        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        const CallInfo &callInfo = args.Info;
        if (callInfo.Count < 2)
        {
            // No arguments passed to Array(), so create with the default size (0).
            return function->GetLibrary()->CreateNativeIntArray();
        }

        JavascriptArray* pNew = nullptr;
        if (callInfo.Count == 2)
        {
            // Exactly one argument, which is the array length if it's a uint32.
            Var firstArgument = args[1];
            int elementCount;
            if (TaggedInt::Is(firstArgument))
            {
                elementCount = TaggedInt::ToInt32(firstArgument);
                if (elementCount < 0)
                {
                    JavascriptError::ThrowRangeError(
                        function->GetScriptContext(), JSERR_ArrayLengthConstructIncorrect);
                }
                pNew = function->GetLibrary()->CreateNativeIntArray(elementCount);
            }
            else if (JavascriptNumber::Is_NoTaggedIntCheck(firstArgument))
            {
                // Non-tagged-int number: make sure the double value is really a uint32.
                double value = JavascriptNumber::GetValue(firstArgument);
                uint32 uvalue = JavascriptConversion::ToUInt32(value);
                if (value != uvalue)
                {
                    JavascriptError::ThrowRangeError(
                        function->GetScriptContext(), JSERR_ArrayLengthConstructIncorrect);
                }
                pNew = function->GetLibrary()->CreateNativeIntArray(uvalue);
            }
            else
            {
                //
                // First element is not int/double
                // create an array of length 1.
                // Set first element as the passed Var
                //

                pNew = function->GetLibrary()->CreateArray(1);
                pNew->DirectSetItemAt<Var>(0, firstArgument);
            }
        }
        else
        {
            // Called with a list of initial element values.
            // Create an array of the appropriate length and walk the list.

            JavascriptNativeIntArray *arr = function->GetLibrary()->CreateNativeIntArray(callInfo.Count - 1);
            pNew = arr->FillFromArgs(callInfo.Count - 1, 0, args.Values);
        }

#ifdef VALIDATE_ARRAY
        pNew->ValidateArray();
#endif

        return pNew;
    }